

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

Error __thiscall
asmjit::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneHeap *heap,size_t newLength,size_t idealCapacity,
          bool newBitsValue)

{
  ulong *puVar1;
  Slot *__src;
  uint uVar2;
  Slot *__dest;
  ulong size;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  size_t allocatedCapacity;
  
  if (idealCapacity < newLength) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
               ,0x1ba,"idealCapacity >= newLength");
  }
  uVar6 = *(ulong *)(this + 8);
  if (uVar6 < newLength) {
    __src = *(Slot **)this;
    __dest = __src;
    if (*(ulong *)(this + 0x10) < newLength) {
      uVar3 = idealCapacity + 0x3f & 0xffffffffffffffc0;
      if (uVar3 < newLength) {
        return 1;
      }
      if (heap->_zone == (Zone *)0x0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                   ,0x18c,"isInitialized()");
      }
      __dest = (Slot *)ZoneHeap::_alloc(heap,uVar3 >> 3,&allocatedCapacity);
      if (__dest == (Slot *)0x0) {
        return 1;
      }
      size = allocatedCapacity * 8;
      if (allocatedCapacity * 8 < allocatedCapacity) {
        size = uVar3;
      }
      if (uVar6 != 0) {
        memcpy(__dest,__src,(uVar6 + 0x40 >> 6) - 1);
      }
      if (__src != (Slot *)0x0) {
        if (heap->_zone == (Zone *)0x0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                     ,0x1af,"isInitialized()");
        }
        uVar3 = *(ulong *)(this + 0x10);
        if (uVar3 < 8) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                     ,0x1b2,"size != 0");
        }
        if (uVar3 < 0x1008) {
          if (uVar3 < 0x408) {
            uVar2 = (uint)((uVar3 >> 3) + 0x1fffffffff >> 5);
          }
          else {
            uVar2 = (int)((uVar3 >> 3) + 0x3fffffff7f >> 6) + 4;
          }
          __src->next = heap->_slots[uVar2];
          heap->_slots[uVar2] = __src;
        }
        else {
          ZoneHeap::_releaseDynamic(heap,__src,size);
        }
      }
      *(Slot **)this = __dest;
      *(ulong *)(this + 0x10) = size;
    }
    uVar3 = uVar6 >> 6;
    uVar2 = (uint)newLength & 0x3f;
    if ((uVar6 & 0x3f) != 0) {
      uVar7 = (uint)(uVar6 & 0x3f);
      if (uVar3 == newLength >> 6) {
        uVar4 = uVar2;
        if (uVar2 <= uVar7) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
                     ,0x203,"startBit < endBit");
        }
      }
      else {
        uVar4 = 0;
      }
      __dest[uVar3].next =
           (Slot *)((ulong)__dest[uVar3].next |
                   (long)-(ulong)newBitsValue << ((ulong)(uVar4 - uVar7) & 0x3f));
      uVar3 = uVar3 + 1;
    }
    lVar5 = (newLength + 0x40 >> 6) - 1;
    uVar6 = lVar5 - (ulong)(lVar5 * 0x40 == newLength);
    for (; uVar3 <= uVar6; uVar3 = uVar3 + 1) {
      __dest[uVar3].next = (Slot *)-(ulong)newBitsValue;
    }
    if ((newLength & 0x3f) != 0) {
      __dest[uVar6].next = (Slot *)((ulong)__dest[uVar6].next & ~(-1L << uVar2));
    }
  }
  else if ((newLength & 0x3f) != 0) {
    puVar1 = (ulong *)(*(long *)this + (newLength >> 6) * 8);
    *puVar1 = *puVar1 & ~(-1L << (newLength & 0x3f));
  }
  *(size_t *)(this + 8) = newLength;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneHeap* heap, size_t newLength, size_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newLength);

  if (newLength <= _length) {
    // The size after the resize is lesser than or equal to the current length.
    size_t idx = newLength / kBitsPerWord;
    size_t bit = newLength % kBitsPerWord;

    // Just set all bits outside of the new length in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newLength` is a multiply of `kBitsPerWord` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_length`.
    if (bit)
      _data[idx] &= (static_cast<uintptr_t>(1) << bit) - 1U;

    _length = newLength;
    return kErrorOk;
  }

  size_t oldLength = _length;
  BitWord* data = _data;

  if (newLength > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) requied.
    size_t minimumCapacityInBits = Utils::alignTo<size_t>(idealCapacity, kBitsPerWord);
    size_t allocatedCapacity;

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newLength))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // Normalize to bytes.
    size_t minimumCapacity = minimumCapacityInBits / 8;
    BitWord* newData = static_cast<BitWord*>(heap->alloc(minimumCapacity, allocatedCapacity));

    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_heap->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (oldLength)
      ::memcpy(newData, data, _wordsPerBits(oldLength));

    if (data)
      heap->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = allocatedCapacityInBits;
  }

  // Start (of the old length) and end (of the new length) bits
  size_t idx = oldLength / kBitsPerWord;
  size_t startBit = oldLength % kBitsPerWord;
  size_t endBit = newLength % kBitsPerWord;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = _patternFromBit(newBitsValue);

  // First initialize the last bit-word of the old length.
  if (startBit) {
    size_t nBits = 0;

    if (idx == (newLength / kBitsPerWord)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old length.
      nBits = kBitsPerWord - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old length.
  size_t endIdx = _wordsPerBits(newLength);
  endIdx -= static_cast<size_t>(endIdx * kBitsPerWord == newLength);

  while (idx <= endIdx)
    data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx] &= (static_cast<BitWord>(1) << endBit) - 1;

  _length = newLength;
  return kErrorOk;
}